

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

bool Assimp::GetNextLine<char>(char **buffer,char *out)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  char *end;
  char *_out;
  char *out_local;
  char **buffer_local;
  
  if (**buffer == '\0') {
    buffer_local._7_1_ = false;
  }
  else {
    end = out;
    while (bVar2 = IsLineEnd<char>(**buffer), !bVar2 && end < out + 0x1000) {
      pcVar1 = *buffer;
      *buffer = pcVar1 + 1;
      *end = *pcVar1;
      end = end + 1;
    }
    *end = '\0';
    while( true ) {
      bVar3 = IsLineEnd<char>(**buffer);
      bVar2 = false;
      if (bVar3) {
        bVar2 = **buffer != '\0';
      }
      if (!bVar2) break;
      *buffer = *buffer + 1;
    }
    buffer_local._7_1_ = true;
  }
  return buffer_local._7_1_;
}

Assistant:

AI_FORCE_INLINE
bool GetNextLine( const char_t*& buffer, char_t out[ BufferSize ] ) {
    if( ( char_t )'\0' == *buffer ) {
        return false;
    }

    char* _out = out;
    char* const end = _out + BufferSize;
    while( !IsLineEnd( *buffer ) && _out < end ) {
        *_out++ = *buffer++;
    }
    *_out = (char_t)'\0';

    while( IsLineEnd( *buffer ) && '\0' != *buffer ) {
        ++buffer;
    }

    return true;
}